

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLFormatter.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XMLFormatter::XMLFormatter
          (XMLFormatter *this,char *outEncoding,char *docVersion,XMLFormatTarget *target,
          EscapeFlags escapeFlags,UnRepFlags unrepFlags,MemoryManager *manager)

{
  MemoryManager *manager_00;
  bool bVar1;
  XMLCh *pXVar2;
  XMLTranscoder *pXVar3;
  TranscodingException *this_00;
  Codes resCode;
  ArrayJanitor<char16_t> jname;
  
  this->fEscapeFlags = escapeFlags;
  this->fOutEncoding = (XMLCh *)0x0;
  this->fTarget = target;
  this->fUnRepFlags = unrepFlags;
  this->fXCoder = (XMLTranscoder *)0x0;
  this->fAposRef = (XMLByte *)0x0;
  this->fAposLen = 0;
  this->fAmpRef = (XMLByte *)0x0;
  this->fAmpLen = 0;
  this->fGTRef = (XMLByte *)0x0;
  this->fGTLen = 0;
  this->fLTRef = (XMLByte *)0x0;
  this->fLTLen = 0;
  this->fQuoteRef = (XMLByte *)0x0;
  this->fQuoteLen = 0;
  this->fIsXML11 = false;
  this->fMemoryManager = manager;
  pXVar2 = XMLString::transcode(outEncoding,manager);
  this->fOutEncoding = pXVar2;
  pXVar3 = XMLTransService::makeNewTranscoderFor
                     (XMLPlatformUtils::fgTransService,pXVar2,&resCode,0x4000,this->fMemoryManager);
  this->fXCoder = pXVar3;
  manager_00 = this->fMemoryManager;
  if (pXVar3 != (XMLTranscoder *)0x0) {
    pXVar2 = XMLString::transcode(docVersion,manager_00);
    ArrayJanitor<char16_t>::ArrayJanitor(&jname,pXVar2,this->fMemoryManager);
    bVar1 = XMLString::equals(pXVar2,L"1.1");
    this->fIsXML11 = bVar1;
    ArrayJanitor<char16_t>::~ArrayJanitor(&jname);
    return;
  }
  (*manager_00->_vptr_MemoryManager[4])(manager_00,this->fOutEncoding);
  this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
  TranscodingException::TranscodingException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/framework/XMLFormatter.cpp"
             ,0xbb,Trans_CantCreateCvtrFor,outEncoding,(char *)0x0,(char *)0x0,(char *)0x0,
             this->fMemoryManager);
  __cxa_throw(this_00,&TranscodingException::typeinfo,XMLException::~XMLException);
}

Assistant:

XMLFormatter::XMLFormatter( const   char* const             outEncoding
                            , const char* const             docVersion
                            ,       XMLFormatTarget* const  target
                            , const EscapeFlags             escapeFlags
                            , const UnRepFlags              unrepFlags
                            ,       MemoryManager* const    manager)
    : fEscapeFlags(escapeFlags)
    , fOutEncoding(0)
    , fTarget(target)
    , fUnRepFlags(unrepFlags)
    , fXCoder(0)
    , fAposRef(0)
    , fAposLen(0)
    , fAmpRef(0)
    , fAmpLen(0)
    , fGTRef(0)
    , fGTLen(0)
    , fLTRef(0)
    , fLTLen(0)
    , fQuoteRef(0)
    , fQuoteLen(0)
    , fIsXML11(false)
    , fMemoryManager(manager)
{
    // Transcode the encoding string
    fOutEncoding = XMLString::transcode(outEncoding, fMemoryManager);

    // Try to create a transcoder for this encoding
    XMLTransService::Codes resCode;
    fXCoder = XMLPlatformUtils::fgTransService->makeNewTranscoderFor
    (
        fOutEncoding
        , resCode
        , kTmpBufSize
        , fMemoryManager
    );

    if (!fXCoder)
    {
        fMemoryManager->deallocate(fOutEncoding); //delete [] fOutEncoding;
        ThrowXMLwithMemMgr1
        (
            TranscodingException
            , XMLExcepts::Trans_CantCreateCvtrFor
            , outEncoding
            , fMemoryManager
        );
    }

    XMLCh* const tmpDocVer = XMLString::transcode(docVersion, fMemoryManager);
    ArrayJanitor<XMLCh> jname(tmpDocVer, fMemoryManager);
    fIsXML11 = XMLString::equals(tmpDocVer, XMLUni::fgVersion1_1);
}